

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::
statement<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[42],std::__cxx11::string,char_const(&)[33],std::__cxx11::string,char_const(&)[55],std::__cxx11::string,char_const(&)[16],unsigned_int&,char_const(&)[8],std::__cxx11::string,char_const(&)[24]>
          (CompilerGLSL *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,
          char (*ts_1) [2],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2,
          char (*ts_3) [42],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_4,
          char (*ts_5) [33],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_6,
          char (*ts_7) [55],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_8,
          char (*ts_9) [16],uint *ts_10,char (*ts_11) [8],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_12,
          char (*ts_13) [24])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint uVar2;
  char (*ts_13_00) [24];
  string local_50;
  
  ts_13_00 = (char (*) [24])0x23a2a7;
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      if (this->indent != 0) {
        uVar2 = 0;
        do {
          StringStream<4096UL,_4096UL>::append(&this->buffer,"    ",4);
          uVar2 = uVar2 + 1;
        } while (uVar2 < this->indent);
      }
      statement_inner<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[42],std::__cxx11::string,char_const(&)[33],std::__cxx11::string,char_const(&)[55],std::__cxx11::string,char_const(&)[16],unsigned_int&,char_const(&)[8],std::__cxx11::string,char_const(&)[24]>
                (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12,ts_13);
      local_50._M_dataplus._M_p._0_1_ = 10;
      StringStream<4096UL,_4096UL>::append(&this->buffer,(char *)&local_50,1);
      return;
    }
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[42],std::__cxx11::string,char_const(&)[33],std::__cxx11::string,char_const(&)[55],std::__cxx11::string,char_const(&)[16],unsigned_int&,char_const(&)[8],std::__cxx11::string,char_const(&)[24]>
              (&local_50,(spirv_cross *)ts,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_1,
               (char (*) [2])ts_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_3,
               (char (*) [42])ts_4,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_5,
               (char (*) [33])ts_6,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_7,
               (char (*) [55])ts_8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_9,
               (char (*) [16])ts_10,(uint *)ts_11,(char (*) [8])ts_12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_13,ts_13_00);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_));
    }
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}